

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MSMSFormat.hpp
# Opt level: O2

Mesh * __thiscall OpenMD::MSMSFormat::ReadShape(MSMSFormat *this)

{
  pointer pVVar1;
  Mesh *pMVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long *plVar6;
  ostream *poVar7;
  allocator<char> local_189;
  Vector3d vertex;
  string line;
  StringTokenizer tokenizer;
  char inbuf [180];
  
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  std::ios::clear((int)this->vertFile_ + (int)this->vertFile_->_vptr_basic_istream[-3]);
  std::istream::seekg(this->vertFile_,0,0);
  while( true ) {
    plVar6 = (long *)std::istream::getline((char *)this->vertFile_,(long)inbuf);
    if ((*(byte *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x20) & 5) != 0) break;
    if (inbuf[0] != '#') {
      std::__cxx11::string::assign((char *)&line);
      std::__cxx11::string::string<std::allocator<char>>((string *)&vertex," ;\t\n\r",&local_189);
      StringTokenizer::StringTokenizer(&tokenizer,&line,(string *)&vertex);
      std::__cxx11::string::~string((string *)&vertex);
      iVar3 = StringTokenizer::countTokens(&tokenizer);
      if (2 < iVar3) {
        Vector<double,_3U>::Vector((Vector<double,_3U> *)&vertex);
        vertex.super_Vector<double,_3U>.data_[0] = StringTokenizer::nextTokenAsDouble(&tokenizer);
        vertex.super_Vector<double,_3U>.data_[1] = StringTokenizer::nextTokenAsDouble(&tokenizer);
        vertex.super_Vector<double,_3U>.data_[2] = StringTokenizer::nextTokenAsDouble(&tokenizer);
        std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::push_back
                  (&this->vertices_,(value_type *)&vertex);
      }
      iVar3 = StringTokenizer::countTokens(&tokenizer);
      if (5 < iVar3) {
        Vector<double,_3U>::Vector((Vector<double,_3U> *)&vertex);
        vertex.super_Vector<double,_3U>.data_[0] = StringTokenizer::nextTokenAsDouble(&tokenizer);
        vertex.super_Vector<double,_3U>.data_[1] = StringTokenizer::nextTokenAsDouble(&tokenizer);
        vertex.super_Vector<double,_3U>.data_[2] = StringTokenizer::nextTokenAsDouble(&tokenizer);
        std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::push_back
                  (&this->normals_,(value_type *)&vertex);
      }
      StringTokenizer::~StringTokenizer(&tokenizer);
    }
  }
  std::ios::clear((int)this->faceFile_ + (int)this->faceFile_->_vptr_basic_istream[-3]);
  std::istream::seekg(this->faceFile_,0,0);
  while( true ) {
    plVar6 = (long *)std::istream::getline((char *)this->faceFile_,(long)inbuf);
    if ((*(byte *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x20) & 5) != 0) break;
    if (inbuf[0] != '#') {
      std::__cxx11::string::assign((char *)&line);
      std::__cxx11::string::string<std::allocator<char>>((string *)&vertex," ;\t\n\r",&local_189);
      StringTokenizer::StringTokenizer(&tokenizer,&line,(string *)&vertex);
      std::__cxx11::string::~string((string *)&vertex);
      iVar3 = StringTokenizer::countTokens(&tokenizer);
      if (2 < iVar3) {
        iVar3 = StringTokenizer::nextTokenAsInt(&tokenizer);
        iVar4 = StringTokenizer::nextTokenAsInt(&tokenizer);
        iVar5 = StringTokenizer::nextTokenAsInt(&tokenizer);
        pVVar1 = (this->vertices_).
                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        Mesh::add(this->mesh_,pVVar1 + (long)iVar3 + -1,pVVar1 + (long)iVar4 + -1,
                  pVVar1 + (long)iVar5 + -1);
      }
      StringTokenizer::~StringTokenizer(&tokenizer);
    }
  }
  poVar7 = std::operator<<((ostream *)&std::cerr,"MSMS files have ");
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::operator<<(poVar7," vertices and ");
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::operator<<(poVar7," facets\n");
  pMVar2 = this->mesh_;
  std::__cxx11::string::~string((string *)&line);
  return pMVar2;
}

Assistant:

Mesh* MSMSFormat::ReadShape() {
    char inbuf[MSMSLINESIZE];
    std::string line;

    vertFile_->clear();
    vertFile_->seekg(0);

    while (vertFile_->getline(inbuf, MSMSLINESIZE)) {
      // ignore comment lines:
      if (inbuf[0] != '#') {
        line = inbuf;
        StringTokenizer tokenizer(line);
        // do we have at least 3 tokens on this vertex line?
        if (tokenizer.countTokens() >= 3) {
          Vector3d vertex;
          // int l0fa, atomid, l;
          vertex[0] = tokenizer.nextTokenAsDouble();
          vertex[1] = tokenizer.nextTokenAsDouble();
          vertex[2] = tokenizer.nextTokenAsDouble();
          vertices_.push_back(vertex);
        }
        if (tokenizer.countTokens() >= 6) {
          Vector3d normal;
          normal[0] = tokenizer.nextTokenAsDouble();
          normal[1] = tokenizer.nextTokenAsDouble();
          normal[2] = tokenizer.nextTokenAsDouble();
          normals_.push_back(normal);
        }
        // l0fa = tokenizer.nextTokenAsInt();
        // atomid = tokenizer.nextTokenAsInt();
        // l = tokenizer.nextTokenAsInt();
      }
    }

    faceFile_->clear();
    faceFile_->seekg(0);
    while (faceFile_->getline(inbuf, MSMSLINESIZE)) {
      // ignore comment lines:
      if (inbuf[0] != '#') {
        line = inbuf;
        StringTokenizer tokenizer(line);
        // do we have at least 3 tokens on this vertex line?
        if (tokenizer.countTokens() >= 3) {
          int v0, v1, v2;
          // int surftype, ana;
          v0 = tokenizer.nextTokenAsInt();
          v1 = tokenizer.nextTokenAsInt();
          v2 = tokenizer.nextTokenAsInt();
          // surftype = tokenizer.nextTokenAsInt();
          // ana = tokenizer.nextTokenAsInt();
          v0--;  // convert from 1-based indexing to 0-based indexing
          v1--;
          v2--;
          mesh_->add(vertices_[v0], vertices_[v1], vertices_[v2]);
        }
      }
    }
    std::cerr << "MSMS files have " << vertices_.size() << " vertices and ";
    std::cerr << mesh_->size() << " facets\n";
    return mesh_;
  }